

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pagerExclusiveLock(Pager *pPager)

{
  u8 uVar1;
  sqlite3_io_methods *psVar2;
  int iVar3;
  
  uVar1 = pPager->eLock;
  iVar3 = pagerLockDb(pPager,4);
  if (iVar3 != 0) {
    psVar2 = pPager->fd->pMethods;
    if (psVar2 != (sqlite3_io_methods *)0x0) {
      if (pPager->noLock == '\0') {
        (*psVar2->xUnlock)(pPager->fd,(int)uVar1);
      }
      if (pPager->eLock != '\x05') {
        pPager->eLock = uVar1;
      }
    }
    pPager->changeCountDone = pPager->tempFile;
  }
  return iVar3;
}

Assistant:

static int pagerExclusiveLock(Pager *pPager){
  int rc;                         /* Return code */
  u8 eOrigLock;                   /* Original lock */

  assert( pPager->eLock>=SHARED_LOCK );
  eOrigLock = pPager->eLock;
  rc = pagerLockDb(pPager, EXCLUSIVE_LOCK);
  if( rc!=SQLITE_OK ){
    /* If the attempt to grab the exclusive lock failed, release the
    ** pending lock that may have been obtained instead.  */
    pagerUnlockDb(pPager, eOrigLock);
  }

  return rc;
}